

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

string * __thiscall antlr::InputBuffer::getMarkedChars_abi_cxx11_(InputBuffer *this)

{
  long in_RSI;
  string *in_RDI;
  uint i;
  string *ret;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  string *this_00;
  undefined4 local_18;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_18 = 0; local_18 < *(uint *)(in_RSI + 0xc); local_18 = local_18 + 1) {
    in_stack_ffffffffffffffbc =
         CircularQueue<int>::elementAt
                   ((CircularQueue<int> *)this_00,
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::__cxx11::string::operator+=((string *)this_00,(char)in_stack_ffffffffffffffbc);
  }
  return in_RDI;
}

Assistant:

string InputBuffer::getMarkedChars( void ) const
{
	ANTLR_USE_NAMESPACE(std)string ret;

	for(unsigned int i = 0; i < markerOffset; i++)
		ret += queue.elementAt(i);

	return ret;
}